

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O2

void get_variance(VPartVar *v)

{
  byte bVar1;
  
  bVar1 = (byte)v->log2_count;
  v->variance = (v->sum_square_error -
                (int)((ulong)((long)v->sum_error * (long)v->sum_error) >> (bVar1 & 0x3f))) * 0x100
                >> (bVar1 & 0x1f);
  return;
}

Assistant:

static inline void get_variance(VPartVar *v) {
  v->variance =
      (int)(256 * (v->sum_square_error -
                   (uint32_t)(((int64_t)v->sum_error * v->sum_error) >>
                              v->log2_count)) >>
            v->log2_count);
}